

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsVarDeserializerFree(JsVarDeserializerHandle deserializerHandle)

{
  JsErrorCode JVar1;
  JsrtContext *currentContext;
  ChakraHostDeserializerHandle *deserializer;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (deserializerHandle == (JsVarDeserializerHandle)0x0) {
    JVar1 = JsErrorNullArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar1 = CheckContext(currentContext,false,false);
    if (JVar1 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      ChakraHostDeserializerHandle::FreeSelf((ChakraHostDeserializerHandle *)deserializerHandle);
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
      JVar1 = JsNoError;
    }
  }
  return JVar1;
}

Assistant:

CHAKRA_API
JsVarDeserializerFree(_In_ JsVarDeserializerHandle deserializerHandle)
{
    PARAM_NOT_NULL(deserializerHandle);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle* deserializer = reinterpret_cast<ChakraHostDeserializerHandle*>(deserializerHandle);
        deserializer->FreeSelf();
        return JsNoError;
    });
}